

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_queued_task.h
# Opt level: O3

void __thiscall
dd::
ClosureTask<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/quick/quick_impl.cc:137:26)>
::~ClosureTask(ClosureTask<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_boss_li[P]quick_quick_quick_impl_cc:137:26)>
               *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_QueuedTask)._vptr_QueuedTask = (_func_int **)&PTR__ClosureTask_0012ea20;
  pcVar2 = (this->_closure).ip._M_dataplus._M_p;
  paVar1 = &(this->_closure).ip.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x50);
  return;
}

Assistant:

explicit ClosureTask(Closure&& closure) :_closure(std::forward<Closure>(closure)) {}